

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string stripped_comment;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  stripped_comment._M_dataplus._M_p = (pointer)&stripped_comment.field_2;
  pcVar1 = (comment_text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stripped_comment,pcVar1,pcVar1 + comment_text->_M_string_length);
  StripWhitespace(&stripped_comment);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringUsing(&stripped_comment,"\n",&lines);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      local_60.text_ = (this->prefix_)._M_dataplus._M_p;
      local_60.size_ = (int)(this->prefix_)._M_string_length;
      local_90.text_ =
           *(char **)((long)lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar2 + -8);
      local_90.size_ =
           *(int *)((long)&((lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2);
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"$0// $1\n",&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)lines.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)lines.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stripped_comment._M_dataplus._M_p != &stripped_comment.field_2) {
    operator_delete(stripped_comment._M_dataplus._M_p,
                    stripped_comment.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatComment(const string& comment_text) {
    string stripped_comment = comment_text;
    StripWhitespace(&stripped_comment);
    std::vector<string> lines = Split(stripped_comment, "\n");
    string output;
    for (int i = 0; i < lines.size(); ++i) {
      const string& line = lines[i];
      strings::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }